

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

Json __thiscall JFSON::anon_unknown_22::JsonParser::parse_json(JsonParser *this,int depth)

{
  size_t sVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  long *plVar12;
  uint uVar13;
  size_t sVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  pointer pJVar16;
  char c;
  int in_EDX;
  char *pcVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined **ppuVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  undefined4 in_register_00000034;
  JsonParser *this_00;
  char *pcVar20;
  undefined1 auVar21 [8];
  pointer pJVar22;
  bool c_00;
  Json JVar23;
  vector<JFSON::Json,_std::allocator<JFSON::Json>_> data;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
  data_1;
  size_type __dnew;
  char buf [12];
  undefined1 local_108 [32];
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  _Base_ptr local_c8;
  size_t local_c0;
  string local_b8;
  string local_98;
  double local_78;
  Json local_70;
  Json local_60;
  char local_4c [12];
  Json local_40;
  
  this_00 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  if (in_EDX < 0xc9) {
    bVar5 = get_next_token(this_00);
    if (this_00->failed == true) {
      Json::Json((Json *)this);
      ppuVar18 = (undefined **)extraout_RDX_00;
      goto LAB_001052b4;
    }
    c_00 = 9 < (byte)(bVar5 - 0x30);
    if (bVar5 != 0x2d && c_00) {
      if (0x6d < bVar5) {
        if (bVar5 != 0x6e) {
          if (bVar5 != 0x7b) {
            if (bVar5 == 0x74) {
              local_e8 = (undefined1  [8])(local_e0 + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"true","");
              Json::Json(&local_60,true);
              JVar23 = expect(this,(string *)this_00,(Json *)local_e8);
              ppuVar18 = JVar23.m_ptr.
                         super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
              local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   local_60.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              goto LAB_0010551e;
            }
LAB_001056d6:
            esc_abi_cxx11_(&local_b8,(JFSON *)(ulong)(uint)(int)(char)bVar5,c_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8,"expected value, got ",&local_b8);
            JVar23 = fail(this,(string *)this_00);
            ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
            if (local_e8 != (undefined1  [8])(local_e0 + 8)) {
              operator_delete((void *)local_e8);
              ppuVar18 = (undefined **)extraout_RDX_04;
            }
            paVar9 = &local_b8.field_2;
            goto LAB_00105724;
          }
          local_e0._16_8_ = local_e0;
          local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
          local_e0._8_8_ = 0;
          local_c0 = 0;
          local_c8 = (_Base_ptr)local_e0._16_8_;
          bVar5 = get_next_token(this_00);
          _Var19._M_pi = extraout_RDX_05;
          if (bVar5 == 0x7d) {
LAB_00105b88:
            Json::Json((Json *)this,(object *)local_e8);
          }
          else {
            do {
              if (bVar5 != 0x22) {
                esc_abi_cxx11_((string *)local_108,(JFSON *)(ulong)(uint)(int)(char)bVar5,
                               (char)_Var19._M_pi);
                std::operator+(&local_b8,"expected \'\"\' in object, got ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                fail(this,(string *)this_00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
                if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                  operator_delete((void *)local_108._0_8_);
                }
                goto LAB_00105b95;
              }
              (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_(&local_b8,this_00);
              if (this_00->failed == true) {
LAB_00105805:
                Json::Json((Json *)this);
                _Var19._M_pi = extraout_RDX_06;
LAB_001059d5:
                iVar7 = 1;
              }
              else {
                bVar5 = get_next_token(this_00);
                if (bVar5 != 0x3a) {
                  if ((char)bVar5 < ' ') {
                    snprintf(local_4c,0xc,"(%d)",(ulong)(uint)(int)(char)bVar5);
                  }
                  else {
                    snprintf(local_4c,0xc,"\'%c\' (%d)",(ulong)bVar5,(ulong)bVar5);
                  }
                  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                  sVar11 = strlen(local_4c);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_98,local_4c,local_4c + sVar11);
                  plVar12 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_98,0,(char *)0x0,0x10939d);
                  local_108._0_8_ = local_108 + 0x10;
                  pJVar22 = (pointer)(plVar12 + 2);
                  if ((pointer)*plVar12 == pJVar22) {
                    local_108._16_8_ =
                         (pJVar22->m_ptr).
                         super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_108._24_8_ = plVar12[3];
                  }
                  else {
                    local_108._16_8_ =
                         (pJVar22->m_ptr).
                         super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_108._0_8_ = (pointer)*plVar12;
                  }
                  local_108._8_8_ = plVar12[1];
                  *plVar12 = (long)pJVar22;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
LAB_001059a2:
                  JVar23 = fail(this,(string *)this_00);
                  _Var19._M_pi = JVar23.m_ptr.
                                 super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_);
                    _Var19._M_pi = extraout_RDX_08;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p);
                    _Var19._M_pi = extraout_RDX_09;
                  }
                  goto LAB_001059d5;
                }
                parse_json((JsonParser *)local_108,depth);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                                        *)local_e8,&local_b8);
                uVar4 = local_108._8_8_;
                uVar3 = local_108._0_8_;
                local_108._0_8_ = (pointer)0x0;
                local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var15 = (pmVar10->m_ptr).
                          super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pmVar10->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)uVar3;
                (pmVar10->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
                if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
                }
                if (this_00->failed == true) goto LAB_00105805;
                bVar5 = get_next_token(this_00);
                if (bVar5 == 0x2c) {
                  bVar5 = get_next_token(this_00);
                  iVar7 = 0;
                  _Var19._M_pi = extraout_RDX_11;
                }
                else {
                  iVar7 = 3;
                  _Var19._M_pi = extraout_RDX_07;
                  if (bVar5 != 0x7d) {
                    esc_abi_cxx11_(&local_98,(JFSON *)(ulong)(uint)(int)(char)bVar5,
                                   (char)extraout_RDX_07);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108,"expected \',\' in object, got ",&local_98);
                    goto LAB_001059a2;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
                _Var19._M_pi = extraout_RDX_10;
              }
            } while (iVar7 == 0);
            if (iVar7 == 3) goto LAB_00105b88;
          }
LAB_00105b95:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                       *)local_e8);
          ppuVar18 = (undefined **)extraout_RDX_14;
          goto LAB_001052b4;
        }
        local_e8 = (undefined1  [8])(local_e0 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"null","");
        Json::Json(&local_40);
        JVar23 = expect(this,(string *)this_00,(Json *)local_e8);
        ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        if (local_40.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          ppuVar18 = (undefined **)extraout_RDX_03;
        }
        goto LAB_0010528f;
      }
      if (bVar5 == 0x22) {
        (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_((string *)local_e8,this_00);
        Json::Json((Json *)this,(string *)local_e8);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_e0 + 8);
        ppuVar18 = (undefined **)extraout_RDX_02;
LAB_00105724:
        auVar21 = (undefined1  [8])(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
        if (auVar21 == (undefined1  [8])paVar9) goto LAB_001052b4;
      }
      else {
        if (bVar5 == 0x5b) {
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (pointer)0x0;
          local_108._16_8_ = (pointer)0x0;
          cVar6 = get_next_token(this_00);
          if (cVar6 == ']') {
LAB_00105bac:
            Json::Json((Json *)this,(array *)local_108);
          }
          else {
            while( true ) {
              this_00->i = this_00->i - 1;
              parse_json((JsonParser *)local_e8,depth);
              std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::emplace_back<JFSON::Json>
                        ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)local_108,
                         (Json *)local_e8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._0_8_);
              }
              if (this_00->failed == true) {
                Json::Json((Json *)this);
                goto LAB_00105c7e;
              }
              cVar6 = get_next_token(this_00);
              if (cVar6 != ',') break;
              get_next_token(this_00);
            }
            if (cVar6 == ']') goto LAB_00105bac;
            esc_abi_cxx11_(&local_b8,(JFSON *)(ulong)(uint)(int)cVar6,c);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8,"expected \',\' in list, got ",&local_b8);
            fail(this,(string *)this_00);
            if (local_e8 != (undefined1  [8])(local_e0 + 8)) {
              operator_delete((void *)local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
          }
LAB_00105c7e:
          std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::~vector
                    ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)local_108);
          ppuVar18 = (undefined **)extraout_RDX_15;
          goto LAB_001052b4;
        }
        if (bVar5 != 0x66) goto LAB_001056d6;
        local_e8 = (undefined1  [8])(local_e0 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"false","");
        Json::Json(&local_70,false);
        JVar23 = expect(this,(string *)this_00,(Json *)local_e8);
        ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
LAB_0010551e:
        if (local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          ppuVar18 = (undefined **)extraout_RDX_01;
        }
        auVar21 = local_e8;
        if (local_e8 == (undefined1  [8])(local_e0 + 8)) goto LAB_001052b4;
      }
    }
    else {
      sVar1 = this_00->i;
      this_00->i = sVar1 - 1;
      pcVar2 = (this_00->str->_M_dataplus)._M_p;
      if (pcVar2[sVar1 - 1] == '-') {
        this_00->i = sVar1;
      }
      sVar14 = this_00->i;
      if (pcVar2[sVar14] == '0') {
        this_00->i = sVar14 + 1;
        if (9 < (byte)(pcVar2[sVar14 + 1] - 0x30U)) {
LAB_0010543a:
          sVar14 = this_00->i;
          cVar6 = pcVar2[sVar14];
          if (sVar14 - (sVar1 - 1) < 10) {
            if (cVar6 == '.') {
LAB_00105570:
              this_00->i = sVar14 + 1;
              if (9 < (byte)(pcVar2[sVar14 + 1] - 0x30U)) {
                pcVar20 = "at least one digit required in fractional part";
                pcVar17 = "";
                goto LAB_00105271;
              }
              sVar14 = sVar14 + 2;
              do {
                this_00->i = sVar14;
                pcVar17 = pcVar2 + sVar14;
                sVar14 = sVar14 + 1;
              } while ((byte)(*pcVar17 - 0x30U) < 10);
              goto LAB_0010559e;
            }
            if ((cVar6 == 'E') || (cVar6 == 'e')) goto LAB_0010559e;
            iVar7 = atoi(pcVar2 + (sVar1 - 1));
            puVar8 = (undefined8 *)operator_new(0x20);
            puVar8[1] = 0x100000001;
            *puVar8 = &PTR___Sp_counted_ptr_inplace_0010da20;
            *(int *)(puVar8 + 3) = iVar7;
            ppuVar18 = &PTR_type_0010da70;
          }
          else {
            if (cVar6 == '.') goto LAB_00105570;
LAB_0010559e:
            sVar14 = this_00->i;
            if ((byte)(pcVar2[sVar14] | 0x20U) == 0x65) {
              this_00->i = sVar14 + 1;
              if ((pcVar2[sVar14 + 1] == '-') || (pcVar2[sVar14 + 1] == '+')) {
                this_00->i = sVar14 + 2;
              }
              sVar14 = this_00->i;
              if (9 < (byte)(pcVar2[sVar14] - 0x30U)) {
                pcVar20 = "at least one digit required in exponent";
                pcVar17 = "";
                goto LAB_00105271;
              }
              do {
                sVar14 = sVar14 + 1;
                this_00->i = sVar14;
              } while ((byte)(pcVar2[sVar14] - 0x30U) < 10);
            }
            local_78 = strtod(pcVar2 + (sVar1 - 1),(char **)0x0);
            puVar8 = (undefined8 *)operator_new(0x20);
            puVar8[1] = 0x100000001;
            *puVar8 = &PTR___Sp_counted_ptr_inplace_0010d8a0;
            puVar8[3] = local_78;
            ppuVar18 = &PTR_type_0010d8f0;
          }
          puVar8[2] = ppuVar18;
          this->str = (string *)(puVar8 + 2);
          this->i = (size_t)puVar8;
          goto LAB_001052b4;
        }
        pJVar22 = (pointer)(local_e0 + 8);
        local_b8._M_dataplus._M_p = (pointer)0x23;
        local_e8 = (undefined1  [8])pJVar22;
        local_e8 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_e8,(ulong)&local_b8);
        local_e0._8_8_ = local_b8._M_dataplus._M_p;
        (((pointer)local_e8)->m_ptr).
        super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x20676e696461656c;
        (((pointer)local_e8)->m_ptr).
        super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7020746f6e207330;
        (((pointer)((long)local_e8 + 0x10))->m_ptr).
        super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x64657474696d7265;
        (((pointer)((long)local_e8 + 0x10))->m_ptr).
        super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x626d756e206e6920;
        *(undefined4 *)
         ((long)&(((pointer)((long)local_e8 + 0x10))->m_ptr).
                 super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7) = 0x73726562;
        local_e0._0_8_ = local_b8._M_dataplus._M_p;
        local_b8._M_dataplus._M_p[(long)&((pointer)local_e8)->m_ptr] = '\0';
        JVar23 = fail(this,(string *)this_00);
        ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        auVar21 = local_e8;
      }
      else {
        if ((byte)(pcVar2[sVar14] - 0x31U) < 9) {
          do {
            sVar14 = sVar14 + 1;
            this_00->i = sVar14;
          } while ((byte)(pcVar2[sVar14] - 0x30U) < 10);
          goto LAB_0010543a;
        }
        uVar13 = (uint)(this_00->str->_M_dataplus)._M_p[sVar14];
        if ((int)uVar13 < 0x20) {
          snprintf((char *)&local_98,0xc,"(%d)");
        }
        else {
          snprintf((char *)&local_98,0xc,"\'%c\' (%d)",(ulong)uVar13,(ulong)uVar13);
        }
        pJVar22 = (pointer)(local_108 + 0x10);
        local_108._0_8_ = pJVar22;
        sVar11 = strlen((char *)&local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,&local_98,(long)&local_98._M_dataplus._M_p + sVar11);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x109443);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar12 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar12 == p_Var15) {
          local_b8.field_2._M_allocated_capacity = (size_type)p_Var15->_vptr__Sp_counted_base;
          local_b8.field_2._8_8_ = plVar12[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = (size_type)p_Var15->_vptr__Sp_counted_base;
          local_b8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_b8._M_string_length = plVar12[1];
        *plVar12 = (long)p_Var15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_b8);
        pJVar16 = (pointer)(plVar12 + 2);
        if ((pointer)*plVar12 == pJVar16) {
          local_e0._8_8_ =
               (pJVar16->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_e0._16_8_ = plVar12[3];
          local_e8 = (undefined1  [8])(local_e0 + 8);
        }
        else {
          local_e0._8_8_ =
               (pJVar16->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_e8 = (undefined1  [8])*plVar12;
        }
        local_e0._0_8_ = plVar12[1];
        *plVar12 = (long)pJVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        JVar23 = fail(this,(string *)this_00);
        ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        if (local_e8 != (undefined1  [8])(local_e0 + 8)) {
          operator_delete((void *)local_e8);
          ppuVar18 = (undefined **)extraout_RDX_12;
        }
        auVar21 = (undefined1  [8])local_108._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
          ppuVar18 = (undefined **)extraout_RDX_13;
          auVar21 = (undefined1  [8])local_108._0_8_;
        }
      }
      if (auVar21 == (undefined1  [8])pJVar22) goto LAB_001052b4;
    }
  }
  else {
    pcVar20 = "exceeded maximum nesting depth";
    pcVar17 = "";
LAB_00105271:
    local_e8 = (undefined1  [8])(local_e0 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,pcVar20,pcVar17);
    JVar23 = fail(this,(string *)this_00);
    ppuVar18 = JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
LAB_0010528f:
    auVar21 = local_e8;
    if (local_e8 == (undefined1  [8])(local_e0 + 8)) goto LAB_001052b4;
  }
  operator_delete((void *)auVar21);
  ppuVar18 = (undefined **)extraout_RDX;
LAB_001052b4:
  JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar18;
  JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar23.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }